

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O0

int __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>::
erase_range(AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
            *this,int start_key,int end_key,bool end_key_inclusive)

{
  bool bVar1;
  byte in_CL;
  int *in_RDI;
  int next_key;
  int num_erased;
  int pos;
  bool in_stack_00000145;
  bool in_stack_00000146;
  bool in_stack_00000147;
  double in_stack_00000148;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
  *in_stack_00000150;
  byte local_49;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar3;
  int local_38;
  int local_2c [4];
  int local_1c;
  int *local_18;
  int *local_10;
  
  if ((in_CL & 1) == 0) {
    local_38 = lower_bound<int>((AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                                 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                in_RDI);
  }
  else {
    local_38 = upper_bound<int>((AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                                 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                in_RDI);
  }
  if (local_38 == 0) {
    local_1c = 0;
  }
  else {
    iVar3 = 0;
    if (local_38 == in_RDI[0x16]) {
      uVar2 = 0x7fffffff;
    }
    else {
      uVar2 = *(undefined4 *)(*(long *)(in_RDI + 0x12) + (long)local_38 * 4);
    }
    while( true ) {
      local_38 = local_38 + -1;
      local_49 = 0;
      if (-1 < local_38) {
        local_10 = (int *)(*(long *)(in_RDI + 0x12) + (long)local_38 * 4);
        local_18 = local_2c;
        bVar1 = AlexCompare::operator()(*(AlexCompare **)(in_RDI + 10),local_10,local_18);
        local_49 = bVar1 ^ 0xff;
      }
      if ((local_49 & 1) == 0) break;
      *(undefined4 *)(*(long *)(in_RDI + 0x12) + (long)local_38 * 4) = uVar2;
      bVar1 = check_exists((AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                            *)CONCAT44(iVar3,uVar2),(int)((ulong)in_RDI >> 0x20));
      iVar3 = (uint)bVar1 + iVar3;
      unset_bit((AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_false>
                 *)CONCAT44(iVar3,uVar2),(int)((ulong)in_RDI >> 0x20));
    }
    in_RDI[0x17] = in_RDI[0x17] - iVar3;
    local_1c = iVar3;
    if ((double)in_RDI[0x17] < *(double *)(in_RDI + 0x1e)) {
      resize(in_stack_00000150,in_stack_00000148,in_stack_00000147,in_stack_00000146,
             in_stack_00000145);
      in_RDI[0x28] = in_RDI[0x28] + 1;
      local_1c = iVar3;
    }
  }
  return local_1c;
}

Assistant:

int erase_range(T start_key, T end_key, bool end_key_inclusive = false) {
    int pos;
    if (end_key_inclusive) {
      pos = upper_bound(end_key);
    } else {
      pos = lower_bound(end_key);
    }

    if (pos == 0) return 0;

    // Erase preceding positions until key value is below the start key
    int num_erased = 0;
    T next_key;
    if (pos == data_capacity_) {
      next_key = kEndSentinel_;
    } else {
      next_key = ALEX_DATA_NODE_KEY_AT(pos);
    }
    pos--;
    while (pos >= 0 &&
           key_greaterequal(ALEX_DATA_NODE_KEY_AT(pos), start_key)) {
      ALEX_DATA_NODE_KEY_AT(pos) = next_key;
      num_erased += check_exists(pos);
      unset_bit(pos);
      pos--;
    }

    num_keys_ -= num_erased;

    if (num_keys_ < contraction_threshold_) {
      resize(kMaxDensity_);  // contract
      num_resizes_++;
    }
    return num_erased;
  }